

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printmetrics.h
# Opt level: O2

bool MetricsDiscovery::printMetricsHelper(bool devicesOnly)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  code *pcVar5;
  uint *puVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong uVar9;
  code *pcVar10;
  char *pcVar11;
  uint32_t a;
  uint32_t a_1;
  size_t sStackY_80;
  IMetricsDeviceLatest *local_60;
  long local_58;
  string check;
  
  lVar4 = dlopen("libigdmd.so",1);
  if (lVar4 == 0) {
    std::__cxx11::string::string((string *)&check,"libigdmd.so",(allocator *)&local_60);
    std::__cxx11::string::append((char *)&check);
    lVar4 = dlopen(check._M_dataplus._M_p,1);
    std::__cxx11::string::~string((string *)&check);
    if ((lVar4 != 0) || (lVar4 = dlopen("libmd.so",1), lVar4 != 0)) goto LAB_0010639f;
    pcVar11 = "Couldn\'t load metrics discovery library!\n";
    goto LAB_0010688d;
  }
LAB_0010639f:
  pcVar5 = (code *)dlsym(lVar4,"OpenAdapterGroup");
  if (pcVar5 == (code *)0x0) {
    pcVar11 = "Couldn\'t get pointer to OpenAdapterGroup!\n";
    sStackY_80 = 0x2a;
LAB_00106807:
    uVar9 = fwrite(pcVar11,sStackY_80,1,_stderr);
    bVar1 = false;
  }
  else {
    check._M_dataplus._M_p = (pointer)0x0;
    uVar2 = (*pcVar5)();
    if (uVar2 == 0) {
      puVar6 = (uint *)(**(code **)(*(long *)check._M_dataplus._M_p + 0x10))();
      if (puVar6 == (uint *)0x0) {
        pcVar11 = "AdapterGroup->GetParams() returned NULL\n";
        sStackY_80 = 0x28;
        goto LAB_00106807;
      }
      printf("MDAPI Headers: v%d.%d.%d, MDAPI Lib: v%d.%d.%d\n",1,0xc,0xaa,(ulong)*puVar6,
             (ulong)puVar6[1],puVar6[2]);
      local_58 = lVar4;
      if (*puVar6 == 1) {
        if (puVar6[1] == 0) goto LAB_00106608;
LAB_00106420:
        pcVar11 = "";
        if (1 < puVar6[3]) {
          pcVar11 = "s";
        }
        printf("Found %u MDAPI Adapter%s:\n",(ulong)puVar6[3],pcVar11);
        for (uVar2 = 0; uVar3 = puVar6[3], uVar2 < uVar3; uVar2 = uVar2 + 1) {
          plVar7 = (long *)(**(code **)(*(long *)check._M_dataplus._M_p + 0x18))
                                     (check._M_dataplus._M_p,uVar2);
          if (plVar7 == (long *)0x0) {
            pcVar11 = "AdapterGroup->GetAdapter() returned NULL, skipping adapter.\n";
            sStackY_80 = 0x3c;
LAB_001064fd:
            fwrite(pcVar11,sStackY_80,1,_stderr);
          }
          else {
            puVar8 = (undefined8 *)(**(code **)(*plVar7 + 0x10))(plVar7);
            if (puVar8 == (undefined8 *)0x0) {
              pcVar11 = "Adapter->GetParams() returned NULL, skipping adapter.\n";
              sStackY_80 = 0x36;
              goto LAB_001064fd;
            }
            pcVar11 = "Unknown";
            if ((ulong)*(uint *)(puVar8 + 6) < 3) {
              pcVar11 = (&PTR_anon_var_dwarf_4fc1_00118da8)[*(uint *)(puVar8 + 6)];
            }
            printf("Adapter %u: %s (%s)\n",(ulong)uVar2,*puVar8,pcVar11);
            printf("\tPCI Vendor Id: %04X, Device Id: %04X, Bus Info: %02X:%02X.%02X\n",
                   (ulong)*(uint *)((long)puVar8 + 0x14),(ulong)*(uint *)((long)puVar8 + 0x1c),
                   (ulong)*(uint *)((long)puVar8 + 0x24),(ulong)*(uint *)(puVar8 + 5),
                   (ulong)*(uint *)((long)puVar8 + 0x2c));
          }
        }
        if (!devicesOnly) {
          for (uVar2 = 0; uVar2 < uVar3; uVar2 = uVar2 + 1) {
            plVar7 = (long *)(**(code **)(*(long *)check._M_dataplus._M_p + 0x18))
                                       (check._M_dataplus._M_p,uVar2);
            if (plVar7 == (long *)0x0) {
              pcVar11 = "AdapterGroup->GetAdapter() returned NULL, skipping adapter.\n";
              sStackY_80 = 0x3c;
LAB_00106735:
              fwrite(pcVar11,sStackY_80,1,_stderr);
            }
            else {
              puVar8 = (undefined8 *)(**(code **)(*plVar7 + 0x10))(plVar7);
              if (puVar8 == (undefined8 *)0x0) {
                pcVar11 = "Adapter->GetParams() returned NULL, skipping adapter.\n";
                sStackY_80 = 0x36;
                goto LAB_00106735;
              }
              pcVar11 = "Unknown";
              if ((ulong)*(uint *)(puVar8 + 6) < 3) {
                pcVar11 = (&PTR_anon_var_dwarf_4fc1_00118da8)[*(uint *)(puVar8 + 6)];
              }
              printf("\nAdapter %u: %s (%s)\n",(ulong)uVar2,*puVar8,pcVar11);
              printf("\tPCI Vendor Id: %04X, Device Id: %04X, Bus Info: %02X:%02X.%02X\n",
                     (ulong)*(uint *)((long)puVar8 + 0x14),(ulong)*(uint *)((long)puVar8 + 0x1c),
                     (ulong)*(uint *)((long)puVar8 + 0x24),(ulong)*(uint *)(puVar8 + 5),
                     (ulong)*(uint *)((long)puVar8 + 0x2c));
              puts("########################################\n");
              local_60 = (IMetricsDeviceLatest *)0x0;
              uVar3 = (**(code **)(*plVar7 + 0x80))(plVar7,&local_60);
              if (uVar3 == 0) {
                printMetricsForDevice(local_60);
                uVar3 = (**(code **)(*plVar7 + 0x30))(plVar7,local_60);
                if (uVar3 != 0) {
                  pcVar11 = "CloseMetricsDevice failed, res: %d\n";
                  goto LAB_00106764;
                }
              }
              else {
                pcVar11 = "OpenMetricsDevice failed, res: %d, skipping adapter.\n";
LAB_00106764:
                fprintf(_stderr,pcVar11,(ulong)uVar3);
              }
            }
            uVar3 = puVar6[3];
          }
        }
      }
      else {
        if (*puVar6 != 0) goto LAB_00106420;
LAB_00106608:
        fwrite("MDAPI Lib version must be at least v1.1!\n",0x29,1,_stderr);
      }
      uVar9 = (**(code **)(*(long *)check._M_dataplus._M_p + 0x20))();
      bVar1 = true;
      lVar4 = local_58;
      if ((int)uVar9 != 0) {
        uVar2 = fprintf(_stderr,"AdapterGroup->Close() failed, res: %d\n",uVar9 & 0xffffffff);
        uVar9 = (ulong)uVar2;
        lVar4 = local_58;
      }
    }
    else {
      bVar1 = false;
      uVar2 = fprintf(_stderr,"OpenAdapterGroup failed, res: %d\n",(ulong)uVar2);
      uVar9 = (ulong)uVar2;
    }
  }
  if (bVar1 || devicesOnly) goto LAB_00106898;
  pcVar5 = (code *)dlsym(lVar4,"OpenMetricsDevice");
  if (pcVar5 == (code *)0x0) {
    pcVar11 = "Couldn\'t get pointer to OpenMetricsDevice!\n";
    sStackY_80 = 0x2b;
  }
  else {
    pcVar10 = (code *)dlsym(lVar4,"CloseMetricsDevice");
    if (pcVar10 == (code *)0x0) {
      pcVar11 = "Couldn\'t get pointer to CloseMetricsDevice!\n";
      sStackY_80 = 0x2c;
    }
    else {
      uVar2 = (*pcVar5)(&check);
      if (uVar2 != 0) {
        pcVar11 = "OpenMetricsDevice failed, res: %d\n";
LAB_00106871:
        uVar2 = fprintf(_stderr,pcVar11,(ulong)uVar2);
        uVar9 = (ulong)uVar2;
        goto LAB_00106898;
      }
      puVar6 = (uint *)(**(code **)(*(long *)check._M_dataplus._M_p + 0x10))();
      if (puVar6 == (uint *)0x0) {
        pcVar11 = "MetricsDevice->GetParams() returned NULL\n";
      }
      else {
        printf("MDAPI Headers: v%d.%d.%d, MDAPI Lib: v%d.%d.%d\n",1,0xc,0xaa,(ulong)*puVar6,
               (ulong)puVar6[1],puVar6[2]);
        uVar2 = *puVar6;
        if (uVar2 == 1) {
          uVar2 = puVar6[1];
        }
        if (uVar2 != 0) {
          printMetricsForDevice((IMetricsDeviceLatest *)check._M_dataplus._M_p);
          uVar9 = (*pcVar10)(check._M_dataplus._M_p);
          uVar2 = (uint)uVar9;
          if (uVar2 == 0) goto LAB_00106898;
          pcVar11 = "CloseMetricsDevice failed, res: %d\n";
          goto LAB_00106871;
        }
        pcVar11 = "MDAPI Lib version must be at least v1.1!\n";
      }
LAB_0010688d:
      sStackY_80 = 0x29;
    }
  }
  uVar9 = fwrite(pcVar11,sStackY_80,1,_stderr);
LAB_00106898:
  return SUB81(uVar9,0);
}

Assistant:

static bool printMetricsHelper(bool devicesOnly)
{
    void* pLibrary = OpenLibrary();
    if (pLibrary == NULL)
    {
        fprintf(stderr, "Couldn't load metrics discovery library!\n");
        return false;
    }

    bool success = printMetricsForAdapterGroup(pLibrary, devicesOnly);
    if (!success && !devicesOnly)
    {
        success = printMetricsForLegacyDevice(pLibrary);
    }

    return success;
}